

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O1

CURLcode Curl_ssl_conn_config_init(Curl_easy *data,connectdata *conn)

{
  _Bool _Var1;
  CURLcode CVar2;
  
  _Var1 = clone_ssl_primary_config(&(data->set).ssl.primary,&conn->ssl_config);
  CVar2 = CURLE_OUT_OF_MEMORY;
  if (_Var1) {
    _Var1 = clone_ssl_primary_config(&(data->set).proxy_ssl.primary,&conn->proxy_ssl_config);
    CVar2 = CURLE_OUT_OF_MEMORY;
    if (_Var1) {
      CVar2 = CURLE_OK;
    }
  }
  return CVar2;
}

Assistant:

CURLcode Curl_ssl_conn_config_init(struct Curl_easy *data,
                                   struct connectdata *conn)
{
  /* Clone "primary" SSL configurations from the esay handle to
   * the connection. They are used for connection cache matching and
   * probably outlive the easy handle */
  if(!clone_ssl_primary_config(&data->set.ssl.primary, &conn->ssl_config))
    return CURLE_OUT_OF_MEMORY;
#ifndef CURL_DISABLE_PROXY
  if(!clone_ssl_primary_config(&data->set.proxy_ssl.primary,
                               &conn->proxy_ssl_config))
    return CURLE_OUT_OF_MEMORY;
#endif
  return CURLE_OK;
}